

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_multiplicative(t_parser *this,bool a_assignable)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  t_script *ptVar4;
  pointer *__ptr;
  undefined7 in_register_00000031;
  long lVar5;
  wchar_t wVar6;
  t_at at;
  t_script *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  lVar5 = CONCAT71(in_register_00000031,a_assignable);
  f_unary(this,a_assignable);
  bVar3 = false;
  do {
    if (*(char *)(lVar5 + 0x68) != '\0') {
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
    iVar1 = *(int *)(lVar5 + 0x88);
    if (iVar1 == 2) {
      wVar6 = L'\x85';
LAB_0016aef0:
      local_38 = *(size_type *)(lVar5 + 0x60);
      _local_48 = *(pointer *)(lVar5 + 0x50);
      _uStack_40 = *(size_type *)(lVar5 + 0x58);
      t_lexer::f_next((t_lexer *)(lVar5 + 8));
      ptVar4 = (t_script *)operator_new(0x38);
      f_unary((t_parser *)&stack0xffffffffffffffb0,a_assignable);
      (ptVar4->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019ac90;
      *(undefined4 *)&(ptVar4->v_path)._M_dataplus._M_p = local_48;
      *(undefined4 *)((long)&(ptVar4->v_path)._M_dataplus._M_p + 4) = uStack_44;
      *(undefined4 *)&(ptVar4->v_path)._M_string_length = uStack_40;
      *(undefined4 *)((long)&(ptVar4->v_path)._M_string_length + 4) = uStack_3c;
      (ptVar4->v_path).field_2._M_allocated_capacity = local_38;
      (ptVar4->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_binary_0019b250;
      (ptVar4->v_path).field_2._M_local_buf[2] = wVar6;
      (ptVar4->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)this->v_module;
      this->v_module = (t_script *)0x0;
      (ptVar4->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = (size_t)local_50;
      local_50 = (t_script *)0x0;
      this->v_module = ptVar4;
      bVar2 = true;
    }
    else {
      if (iVar1 == 7) {
        wVar6 = L'S';
        goto LAB_0016aef0;
      }
      if (iVar1 == 0xc) {
        wVar6 = L'l';
        goto LAB_0016aef0;
      }
      bVar3 = true;
      bVar2 = false;
    }
    if (!bVar2) {
      if (!bVar3) {
        if (this->v_module != (t_script *)0x0) {
          (*(this->v_module->super_t_body)._vptr_t_body[1])();
        }
        this->v_module = (t_script *)0x0;
      }
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
  } while( true );
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_multiplicative(bool a_assignable)
{
	auto node = f_unary(a_assignable);
	while (!v_lexer.f_newline()) {
		t_instruction instruction;
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__ASTERISK:
			instruction = c_instruction__MULTIPLY_TT;
			break;
		case t_lexer::c_token__SLASH:
			instruction = c_instruction__DIVIDE_TT;
			break;
		case t_lexer::c_token__PERCENT:
			instruction = c_instruction__MODULUS_TT;
			break;
		default:
			return node;
		}
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, instruction, std::move(node), f_unary(false)));
	}
	return node;
}